

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O1

void cmpseq(seqdiff_results_t *results)

{
  sd_lookup_t *psVar1;
  int iVar2;
  gzFile pgVar3;
  kseq_t *pkVar4;
  sd_lookup_t *psVar5;
  void *pvVar6;
  undefined8 *puVar7;
  void *pvVar8;
  sd_lookup_t *psVar9;
  FILE *fp;
  char **ppcVar10;
  
  pgVar3 = (gzFile)gzopen(results->first_file,"r");
  if (pgVar3 == (gzFile)0x0) {
    results = (seqdiff_results_t *)&results->first_file;
    cmpseq_cold_2();
  }
  else {
    pkVar4 = kseq_init(pgVar3);
    while (iVar2 = kseq_read(pkVar4), -1 < iVar2) {
      results->first_file_total = results->first_file_total + 1;
      sd_add_seq(pkVar4,1,results->use_header);
    }
    kseq_destroy(pkVar4);
    gzclose(pgVar3);
    pgVar3 = (gzFile)gzopen(results->second_file,"r");
    if (pgVar3 != (gzFile)0x0) {
      pkVar4 = kseq_init(pgVar3);
      while (iVar2 = kseq_read(pkVar4), -1 < iVar2) {
        results->second_file_total = results->second_file_total + 1;
        sd_add_seq(pkVar4,2,results->use_header);
      }
      kseq_destroy(pkVar4);
      gzclose(pgVar3);
      if (sd_lookup == (sd_lookup_t *)0x0) {
LAB_00101e78:
        sd_delete_hash();
        return;
      }
      psVar1 = (sd_lookup_t *)(sd_lookup->hh).next;
      psVar9 = sd_lookup;
      do {
        psVar5 = psVar1;
        iVar2 = psVar9->in_a;
        if ((iVar2 == 1) && (psVar9->in_b == 0)) {
          results->first_file_uniq = results->first_file_uniq + 1;
          if (results->only_summarize == 0) {
            fprintf(_stdout,"%s\t\n",psVar9->name);
          }
          fp = results->a_output_fp;
LAB_00101e43:
          if (fp != (FILE *)0x0) {
            print_fasta(fp,psVar9->name,psVar9->comment,psVar9->seq,0x32);
          }
        }
        else {
          if ((iVar2 == 0) && (psVar9->in_b == 1)) {
            results->second_file_uniq = results->second_file_uniq + 1;
            if (results->only_summarize == 0) {
              fprintf(_stdout,"\t%s\n",psVar9->name);
            }
            fp = results->b_output_fp;
            goto LAB_00101e43;
          }
          if ((iVar2 == 1) && (psVar9->in_b == 1)) {
            results->common = results->common + 1;
            if (results->only_summarize == 0) {
              fprintf(_stdout,"%s\t%s\n",psVar9->name);
            }
            fp = results->c_output_fp;
            goto LAB_00101e43;
          }
        }
        if (psVar5 == (sd_lookup_t *)0x0) goto LAB_00101e78;
        psVar1 = (sd_lookup_t *)(psVar5->hh).next;
        psVar9 = psVar5;
      } while( true );
    }
  }
  ppcVar10 = &results->second_file;
  cmpseq_cold_1();
  pvVar6 = calloc(1,0x70);
  puVar7 = (undefined8 *)calloc(1,0x20);
  puVar7[3] = ppcVar10;
  pvVar8 = malloc(0xffff);
  *puVar7 = pvVar8;
  *(undefined8 **)((long)pvVar6 + 0x68) = puVar7;
  return;
}

Assistant:

void cmpseq(seqdiff_results_t *results) {
	gzFile fp;
	int l;
	kseq_t *seq;
	sd_lookup_t *s,*temp;

	/* open first sequence file */
	fp = gzopen(results->first_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,results->first_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */
	
	while((l = kseq_read(seq)) >= 0) {
		results->first_file_total++; /* increment first_file_total */
		sd_add_seq(seq,1,results->use_header);
	}

	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	/* process second_file */
	fp = gzopen(results->second_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,results->second_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */
	
	while((l = kseq_read(seq)) >= 0) {
		results->second_file_total++; /* increment second_file_total */
		sd_add_seq(seq,2,results->use_header);
	}

	kseq_destroy(seq); /* free kseq struct */
	gzclose(fp); /* done reading file */

	HASH_ITER(hh, sd_lookup, s, temp) {
		if (s->in_a == 1 && s->in_b == 0) {
			results->first_file_uniq++;
			if (!results->only_summarize)
				fprintf(stdout,"%s\t\n",s->name);
			/* printing out fasta or fastq????? */
			if (results->a_output_fp != NULL)
				print_fasta(results->a_output_fp, s->name, s->comment, s->seq, 50);
		} else if (s->in_a == 0 && s->in_b == 1) {
			results->second_file_uniq++;
			if (!results->only_summarize)
				fprintf(stdout,"\t%s\n",s->name);
			if (results->b_output_fp != NULL)
				print_fasta(results->b_output_fp, s->name, s->comment, s->seq, 50);
		} else if (s->in_a == 1 && s->in_b == 1) {
			results->common++;
			if (!results->only_summarize)
				fprintf(stdout,"%s\t%s\n",s->name,s->name);
			if (results->c_output_fp != NULL) {
				print_fasta(results->c_output_fp, s->name, s->comment, s->seq, 50);
			}
		}
	}

	sd_delete_hash(); /* free the hash nodes */
}